

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O1

void mbedtls_arc4_setup(mbedtls_arc4_context *ctx,uchar *key,uint keylen)

{
  uchar uVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  
  ctx->x = 0;
  ctx->y = 0;
  lVar2 = 0;
  do {
    ctx->m[lVar2] = (uchar)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  uVar3 = 0;
  bVar4 = 0;
  do {
    if (keylen <= uVar3) {
      uVar3 = 0;
    }
    uVar1 = ctx->m[lVar2];
    bVar4 = bVar4 + uVar1 + key[uVar3];
    ctx->m[lVar2] = ctx->m[bVar4];
    ctx->m[bVar4] = uVar1;
    lVar2 = lVar2 + 1;
    uVar3 = uVar3 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void mbedtls_arc4_setup( mbedtls_arc4_context *ctx, const unsigned char *key,
                 unsigned int keylen )
{
    int i, j, a;
    unsigned int k;
    unsigned char *m;

    ctx->x = 0;
    ctx->y = 0;
    m = ctx->m;

    for( i = 0; i < 256; i++ )
        m[i] = (unsigned char) i;

    j = k = 0;

    for( i = 0; i < 256; i++, k++ )
    {
        if( k >= keylen ) k = 0;

        a = m[i];
        j = ( j + a + key[k] ) & 0xFF;
        m[i] = m[j];
        m[j] = (unsigned char) a;
    }
}